

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O0

void __thiscall Downloader::calculateTimeRemaining(Downloader *this,qint64 received,qint64 total)

{
  QLabel *pQVar1;
  int iVar2;
  uint uVar3;
  QString local_1b0;
  QString local_198;
  QString local_180;
  QString local_168;
  QLatin1Char local_14b;
  QChar local_14a;
  QString local_148;
  QString local_130;
  int local_114;
  undefined1 local_110 [4];
  int seconds;
  QLatin1Char local_f3;
  QChar local_f2;
  QString local_f0;
  QString local_d8;
  int local_bc;
  undefined1 local_b8 [4];
  int minutes;
  QLatin1Char local_9b;
  QChar local_9a;
  QString local_98;
  QString local_80;
  int local_64;
  double dStack_60;
  int hours;
  qreal timeRemaining;
  QString timeString;
  QDateTime local_30 [12];
  uint local_24;
  qint64 qStack_20;
  uint difference;
  qint64 total_local;
  qint64 received_local;
  Downloader *this_local;
  
  qStack_20 = total;
  total_local = received;
  received_local = (qint64)this;
  QDateTime::currentDateTime();
  iVar2 = QDateTime::toSecsSinceEpoch();
  uVar3 = iVar2 - this->m_startTime;
  QDateTime::~QDateTime(local_30);
  if (uVar3 != 0) {
    local_24 = uVar3;
    QString::QString((QString *)&timeRemaining);
    dStack_60 = (double)((qStack_20 - total_local) / (total_local / (long)(ulong)local_24));
    if (dStack_60 <= 7200.0) {
      if (dStack_60 <= 60.0) {
        if (dStack_60 <= 60.0) {
          local_114 = (int)(dStack_60 + 0.5);
          if (local_114 < 2) {
            tr(&local_168,"1 second",(char *)0x0,-1);
            QString::operator=((QString *)&timeRemaining,&local_168);
            QString::~QString(&local_168);
          }
          else {
            tr(&local_148,"%1 seconds",(char *)0x0,-1);
            iVar2 = local_114;
            QLatin1Char::QLatin1Char(&local_14b,' ');
            QChar::QChar(&local_14a,local_14b);
            QString::arg(&local_130,&local_148,iVar2,0,10,local_14a);
            QString::operator=((QString *)&timeRemaining,&local_130);
            QString::~QString(&local_130);
            QString::~QString(&local_148);
          }
        }
      }
      else {
        dStack_60 = dStack_60 / 60.0;
        local_bc = (int)(dStack_60 + 0.5);
        if (local_bc < 2) {
          tr((QString *)local_110,"1 minute",(char *)0x0,-1);
          QString::operator=((QString *)&timeRemaining,(QString *)local_110);
          QString::~QString((QString *)local_110);
        }
        else {
          tr(&local_f0,"%1 minutes",(char *)0x0,-1);
          iVar2 = local_bc;
          QLatin1Char::QLatin1Char(&local_f3,' ');
          QChar::QChar(&local_f2,local_f3);
          QString::arg(&local_d8,&local_f0,iVar2,0,10,local_f2);
          QString::operator=((QString *)&timeRemaining,&local_d8);
          QString::~QString(&local_d8);
          QString::~QString(&local_f0);
        }
      }
    }
    else {
      dStack_60 = dStack_60 / 3600.0;
      local_64 = (int)(dStack_60 + 0.5);
      if (local_64 < 2) {
        tr((QString *)local_b8,"about one hour",(char *)0x0,-1);
        QString::operator=((QString *)&timeRemaining,(QString *)local_b8);
        QString::~QString((QString *)local_b8);
      }
      else {
        tr(&local_98,"about %1 hours",(char *)0x0,-1);
        iVar2 = local_64;
        QLatin1Char::QLatin1Char(&local_9b,' ');
        QChar::QChar(&local_9a,local_9b);
        QString::arg(&local_80,&local_98,iVar2,0,10,local_9a);
        QString::operator=((QString *)&timeRemaining,&local_80);
        QString::~QString(&local_80);
        QString::~QString(&local_98);
      }
    }
    pQVar1 = (this->m_ui->super_Ui_Downloader).timeLabel;
    tr(&local_1b0,"Time remaining",(char *)0x0,-1);
    operator+(&local_198,&local_1b0,": ");
    operator+(&local_180,&local_198,(QString *)&timeRemaining);
    QLabel::setText((QString *)pQVar1);
    QString::~QString(&local_180);
    QString::~QString(&local_198);
    QString::~QString(&local_1b0);
    QString::~QString((QString *)&timeRemaining);
  }
  return;
}

Assistant:

void Downloader::calculateTimeRemaining(qint64 received, qint64 total)
{
   uint difference = QDateTime::currentDateTime().toSecsSinceEpoch() - m_startTime;

   if (difference > 0)
   {
      QString timeString;
      qreal timeRemaining = (total - received) / (received / difference);

      if (timeRemaining > 7200)
      {
         timeRemaining /= 3600;
         int hours = int(timeRemaining + 0.5);

         if (hours > 1)
            timeString = tr("about %1 hours").arg(hours);
         else
            timeString = tr("about one hour");
      }

      else if (timeRemaining > 60)
      {
         timeRemaining /= 60;
         int minutes = int(timeRemaining + 0.5);

         if (minutes > 1)
            timeString = tr("%1 minutes").arg(minutes);
         else
            timeString = tr("1 minute");
      }

      else if (timeRemaining <= 60)
      {
         int seconds = int(timeRemaining + 0.5);

         if (seconds > 1)
            timeString = tr("%1 seconds").arg(seconds);
         else
            timeString = tr("1 second");
      }

      m_ui->timeLabel->setText(tr("Time remaining") + ": " + timeString);
   }
}